

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

char * doctest::skipPathFromFilename(char *file)

{
  ContextOptions *pCVar1;
  char *pcVar2;
  char *in_RDI;
  char *forward;
  char *back;
  char *local_20;
  char *local_8;
  
  pCVar1 = getContextOptions();
  local_8 = in_RDI;
  if ((pCVar1->no_path_in_filenames & 1U) != 0) {
    pcVar2 = strrchr(in_RDI,0x5c);
    local_20 = strrchr(in_RDI,0x2f);
    if ((pcVar2 != (char *)0x0) || (local_20 != (char *)0x0)) {
      if (local_20 < pcVar2) {
        local_20 = pcVar2;
      }
      local_8 = local_20 + 1;
    }
  }
  return local_8;
}

Assistant:

const char* skipPathFromFilename(const char* file) {
#ifndef DOCTEST_CONFIG_DISABLE
    if(getContextOptions()->no_path_in_filenames) {
        auto back    = std::strrchr(file, '\\');
        auto forward = std::strrchr(file, '/');
        if(back || forward) {
            if(back > forward)
                forward = back;
            return forward + 1;
        }
    }
#endif // DOCTEST_CONFIG_DISABLE
    return file;
}